

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals,false,true,false,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  uint64_t uVar4;
  long lVar5;
  uint64_t uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int64_t *piVar12;
  sel_t sVar13;
  long lVar14;
  ulong uVar15;
  unsigned_long uVar16;
  
  if (count + 0x3f < 0x40) {
    lVar14 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar14 = 0;
    uVar8 = 0;
    uVar11 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar16 = 0xffffffffffffffff;
      }
      else {
        uVar16 = puVar1[uVar8];
      }
      uVar15 = uVar11 + 0x40;
      if (count <= uVar11 + 0x40) {
        uVar15 = count;
      }
      uVar9 = uVar11;
      if (uVar16 == 0xffffffffffffffff) {
        if (uVar11 < uVar15) {
          psVar2 = sel->sel_vector;
          uVar4 = rdata->lower;
          lVar5 = rdata->upper;
          psVar3 = false_sel->sel_vector;
          piVar12 = &ldata[uVar11].upper;
          do {
            uVar9 = uVar11;
            if (psVar2 != (sel_t *)0x0) {
              uVar9 = (ulong)psVar2[uVar11];
            }
            uVar6 = ((hugeint_t *)(piVar12 + -1))->lower;
            lVar7 = *piVar12;
            psVar3[lVar14] = (sel_t)uVar9;
            lVar14 = lVar14 + (ulong)(lVar7 == lVar5 && uVar6 == uVar4);
            uVar11 = uVar11 + 1;
            piVar12 = piVar12 + 2;
            uVar9 = uVar11;
          } while (uVar15 != uVar11);
        }
      }
      else if (uVar16 == 0) {
        uVar9 = uVar15;
        if (uVar11 < uVar15) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            uVar10 = uVar11;
            if (psVar2 != (sel_t *)0x0) {
              uVar10 = (ulong)psVar2[uVar11];
            }
            psVar3[lVar14] = (sel_t)uVar10;
            lVar14 = lVar14 + 1;
            uVar11 = uVar11 + 1;
          } while (uVar15 != uVar11);
        }
      }
      else if (uVar11 < uVar15) {
        psVar2 = sel->sel_vector;
        psVar3 = false_sel->sel_vector;
        piVar12 = &ldata[uVar11].upper;
        uVar9 = 0;
        do {
          if (psVar2 == (sel_t *)0x0) {
            sVar13 = (int)uVar11 + (int)uVar9;
          }
          else {
            sVar13 = psVar2[uVar11 + uVar9];
          }
          if ((uVar16 >> (uVar9 & 0x3f) & 1) == 0) {
            uVar10 = 1;
          }
          else {
            uVar10 = (ulong)(*piVar12 == rdata->upper &&
                            ((hugeint_t *)(piVar12 + -1))->lower == rdata->lower);
          }
          psVar3[lVar14] = sVar13;
          lVar14 = lVar14 + uVar10;
          uVar9 = uVar9 + 1;
          piVar12 = piVar12 + 2;
        } while ((uVar11 - uVar15) + uVar9 != 0);
        uVar9 = uVar11 + uVar9;
      }
      uVar8 = uVar8 + 1;
      uVar11 = uVar9;
    } while (uVar8 != count + 0x3f >> 6);
  }
  return count - lVar14;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}